

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O0

size_t nivalis::OpCode::n_args(uint32_t opcode)

{
  uint32_t opcode_local;
  size_t local_8;
  
  if (opcode < 4) {
LAB_0011f360:
    local_8 = 0;
  }
  else {
    if (opcode != 8) {
      if (opcode == 9) goto LAB_0011f360;
      if (opcode - 0x10 < 3) {
        return 3;
      }
      if ((((opcode != 0x18) && (1 < opcode - 0x20)) && (2 < opcode - 0x30)) &&
         (((1 < opcode - 0x40 && (4 < opcode - 0x50)) &&
          ((5 < opcode - 0x60 && (6 < opcode - 0x4000)))))) {
        return 1;
      }
    }
    local_8 = 2;
  }
  return local_8;
}

Assistant:

size_t n_args(uint32_t opcode) {
    using namespace nivalis::OpCode; switch(opcode) {
        case OpCode::null: case val: case ref:
        case thunk_jmp: case arg:
            return 0;
        case bsel: case add: case sub: case mul: case divi: case mod:
        case power: case logbase: case max: case min:
        case land: case lor: case lxor:
        case gcd: case lcm:
        case choose: case fafact: case rifact: case betab: case polygammab:
        case lt: case le: case eq: case ne: case ge: case gt:
        case thunk_ret:
            return 2;
        case sums: case prods: case bnz:
            return 3;
        // case call: return -1;
    }
    return 1;
}